

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u8 *puVar1;
  char *pcVar2;
  ushort uVar3;
  u16 uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort *puVar7;
  ushort uVar8;
  ushort uVar9;
  undefined8 uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  u8 *__src;
  uint uVar20;
  
  puVar1 = pPage->aData;
  uVar14 = (ulong)pPage->hdrOffset;
  uVar9 = pPage->cellOffset;
  uVar5 = pPage->nCell;
  uVar12 = (uint)uVar9 + (uint)uVar5 * 2;
  uVar13 = pPage->pBt->usableSize;
  uVar19 = (ulong)uVar13;
  if (nMaxFrag < (int)(uint)puVar1[uVar14 + 7]) {
LAB_00167e3b:
    uVar18 = uVar13;
    if ((ulong)uVar5 != 0) {
      uVar8 = *(ushort *)(puVar1 + uVar14 + 5) << 8 | *(ushort *)(puVar1 + uVar14 + 5) >> 8;
      pcVar2 = pPage->pBt->pPager->pTmpSpace;
      memcpy(pcVar2 + uVar8,puVar1 + uVar8,(long)(int)(uVar13 - uVar8));
      uVar15 = 0;
      do {
        uVar3 = *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar9) << 8 |
                *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar9) >> 8;
        if (((uint)uVar3 < (uint)uVar8) ||
           (uVar20 = (uint)uVar3, uVar20 != uVar13 - 4 && (int)(uVar13 - 4) <= (int)(uint)uVar3)) {
          uVar10 = 0x1101b;
          goto LAB_00168057;
        }
        __src = (u8 *)(pcVar2 + uVar20);
        uVar4 = (*pPage->xCellSize)(pPage,__src);
        uVar18 = (int)uVar19 - (uint)uVar4;
        uVar19 = (ulong)uVar18;
        if (((int)uVar18 < (int)(uint)uVar8) || ((int)uVar13 < (int)(uVar20 + uVar4))) {
          uVar10 = 0x11021;
          goto LAB_00168057;
        }
        *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar9) = (ushort)uVar18 << 8 | (ushort)uVar18 >> 8;
        memcpy(puVar1 + uVar19,__src,(ulong)uVar4);
        uVar15 = uVar15 + 1;
      } while (uVar5 != uVar15);
    }
    puVar1[uVar14 + 7] = '\0';
  }
  else {
    uVar8 = *(ushort *)(puVar1 + uVar14 + 1) << 8 | *(ushort *)(puVar1 + uVar14 + 1) >> 8;
    if ((int)(uVar13 - 4) < (int)(uint)uVar8) {
      uVar10 = 0x10fe6;
      goto LAB_00168057;
    }
    if (uVar8 == 0) goto LAB_00167e3b;
    uVar3 = *(ushort *)(puVar1 + uVar8) << 8 | *(ushort *)(puVar1 + uVar8) >> 8;
    if (uVar13 - 4 < (uint)uVar3) {
      uVar10 = 0x10fe9;
      goto LAB_00168057;
    }
    if ((uVar3 != 0) && ((puVar1[uVar3] != '\0' || (puVar1[(ulong)uVar3 + 1] != '\0'))))
    goto LAB_00167e3b;
    uVar5 = *(ushort *)(puVar1 + uVar14 + 5) << 8 | *(ushort *)(puVar1 + uVar14 + 5) >> 8;
    iVar17 = (uint)uVar8 - (uint)uVar5;
    if ((uint)uVar8 < (uint)uVar5 || iVar17 == 0) {
      uVar10 = 0x10ff1;
      goto LAB_00168057;
    }
    uVar6 = *(ushort *)(puVar1 + (ulong)uVar8 + 2) << 8 |
            *(ushort *)(puVar1 + (ulong)uVar8 + 2) >> 8;
    uVar20 = (uint)uVar6;
    uVar18 = (uint)uVar6 + (uint)uVar8;
    if (uVar3 == 0) {
      uVar16 = 0;
      if ((int)uVar13 < (int)uVar18) {
        uVar10 = 0x10ffa;
        goto LAB_00168057;
      }
    }
    else {
      if (uVar3 < uVar18) {
        uVar10 = 0x10ff4;
        goto LAB_00168057;
      }
      uVar11 = *(ushort *)(puVar1 + (ulong)uVar3 + 2) << 8 |
               *(ushort *)(puVar1 + (ulong)uVar3 + 2) >> 8;
      uVar16 = (uint)uVar11;
      if ((int)uVar13 < (int)((uint)uVar11 + (uint)uVar3)) {
        uVar10 = 0x10ff6;
        goto LAB_00168057;
      }
      memmove(puVar1 + (uVar11 + uVar18),puVar1 + uVar18,(long)(int)(uVar3 - uVar18));
      uVar20 = (uint)uVar6 + (uint)uVar11;
    }
    uVar18 = uVar20 + uVar5;
    memmove(puVar1 + uVar18,puVar1 + (uint)uVar5,(long)iVar17);
    if (uVar9 < uVar12) {
      puVar7 = (ushort *)(puVar1 + uVar9);
      do {
        uVar9 = *puVar7 << 8 | *puVar7 >> 8;
        uVar13 = uVar20;
        if ((uVar9 < uVar8) || (uVar13 = uVar16, uVar9 < uVar3)) {
          uVar9 = uVar9 + (short)uVar13;
          *puVar7 = uVar9 * 0x100 | uVar9 >> 8;
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 < puVar1 + uVar12);
    }
  }
  if ((uint)puVar1[uVar14 + 7] + (uVar18 - uVar12) == pPage->nFree) {
    *(ushort *)(puVar1 + uVar14 + 5) = (ushort)uVar18 << 8 | (ushort)uVar18 >> 8;
    (puVar1 + uVar14 + 1)[0] = '\0';
    (puVar1 + uVar14 + 1)[1] = '\0';
    memset(puVar1 + uVar12,0,(long)(int)(uVar18 - uVar12));
    return 0;
  }
  uVar10 = 0x1102f;
LAB_00168057:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
              "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  return 0xb;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  if( nCell>0 ){
    temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
    memcpy(&temp[iCellStart], &data[iCellStart], usableSize - iCellStart);
    src = temp;
    for(i=0; i<nCell; i++){
      u8 *pAddr;     /* The i-th cell pointer */
      pAddr = &data[cellOffset + i*2];
      pc = get2byte(pAddr);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      /* These conditions have already been verified in btreeInitPage()
      ** if PRAGMA cell_size_check=ON.
      */
      if( pc<iCellStart || pc>iCellLast ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( pc>=iCellStart && pc<=iCellLast );
      size = pPage->xCellSize(pPage, &src[pc]);
      cbrk -= size;
      if( cbrk<iCellStart || pc+size>usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( cbrk+size<=usableSize && cbrk>=iCellStart );
      testcase( cbrk+size==usableSize );
      testcase( pc+size==usableSize );
      put2byte(pAddr, cbrk);
      memcpy(&data[cbrk], &src[pc], size);
    }
  }
  data[hdr+7] = 0;

defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}